

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcoll.cpp
# Opt level: O1

int __thiscall
CVmObjCollection::get_prop
          (CVmObjCollection *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t self_val;
  vm_val_t local_40;
  
  local_40.typ = VM_OBJ;
  local_40.val.obj = self;
  iVar1 = const_get_coll_prop(this,prop,retval,&local_40,source_obj,argc);
  if (iVar1 == 0) {
    iVar1 = CVmObject::get_prop(&this->super_CVmObject,prop,retval,self,source_obj,argc);
  }
  else {
    vVar2 = CVmMetaclass::get_class_obj(metaclass_reg_);
    *source_obj = vVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjCollection::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                               vm_obj_id_t self, vm_obj_id_t *source_obj,
                               uint *argc)
{
    vm_val_t self_val;

    /* set up the 'self' value */
    self_val.set_obj(self);

    /* use the constant collection version */
    if (const_get_coll_prop(vmg_ prop, retval, &self_val, source_obj, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}